

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall Privkey_ConvertWif_error_Test::TestBody(Privkey_ConvertWif_error_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_d0;
  AssertHelper local_b0;
  Message local_a8;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  CfdException *cfd_except;
  string wif;
  undefined1 local_30 [8];
  Privkey privkey;
  Privkey_ConvertWif_error_Test *this_local;
  
  privkey._24_8_ = this;
  cfd::core::Privkey::Privkey((Privkey *)local_30);
  cfd::core::Privkey::ConvertWif_abi_cxx11_
            ((string *)&cfd_except,(Privkey *)local_30,kMainnet,false);
  std::__cxx11::string::~string((string *)&cfd_except);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  local_99 = false;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d0,(internal *)local_98,(AssertionResult *)0x6a1824,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x78,message);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  return;
}

Assistant:

TEST(Privkey, ConvertWif_error) {
  try {
    Privkey privkey;
    std::string wif = privkey.ConvertWif(NetType::kMainnet, false);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "Error Private key to WIF.");
    return;
  }
  ASSERT_TRUE(false);
}